

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void __thiscall Matrix::append(Matrix *this,QpVector *vec)

{
  size_type sVar1;
  const_reference pvVar2;
  value_type_conflict2 *__x;
  int *in_RSI;
  long in_RDI;
  HighsInt i;
  value_type_conflict2 *in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  int local_18;
  
  if (*(int *)(in_RDI + 0x5c) == 0) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60));
    if (sVar1 == 0) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  for (local_18 = 0; local_18 < *in_RSI; local_18 = local_18 + 1) {
    in_stack_ffffffffffffffc0 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x78);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_18);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffd0,
               (value_type_conflict2 *)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x90);
    in_stack_ffffffffffffffc8 = (vector<double,_std::allocator<double>_> *)(in_RSI + 8);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_18);
    std::vector<double,_std::allocator<double>_>::operator[]
              (in_stack_ffffffffffffffc8,(long)*pvVar2);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffffd0,(value_type_conflict1 *)in_stack_ffffffffffffffc8);
  }
  __x = (value_type_conflict2 *)(in_RDI + 0x60);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)*(int *)(in_RDI + 0x5c));
  std::vector<int,_std::allocator<int>_>::push_back(in_stack_ffffffffffffffc0,__x);
  *(int *)(in_RDI + 0x5c) = *(int *)(in_RDI + 0x5c) + 1;
  *(undefined1 *)(in_RDI + 0x50) = 0;
  return;
}

Assistant:

void append(const QpVector& vec) {
    if (mat.num_col == 0 && mat.start.size() == 0) {
      mat.start.push_back(0);
    }
    for (HighsInt i = 0; i < vec.num_nz; i++) {
      mat.index.push_back(vec.index[i]);
      mat.value.push_back(vec.value[vec.index[i]]);
    }
    mat.start.push_back(mat.start[mat.num_col] + vec.num_nz);
    mat.num_col++;
    has_transpose = false;
  }